

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t gnu_sparse_01_parse(archive_read *a,tar *tar,char *p)

{
  wchar_t wVar1;
  int64_t offset_00;
  archive_read *in_RDX;
  int64_t size;
  int64_t offset;
  char *e;
  size_t in_stack_ffffffffffffffb8;
  uint7 in_stack_ffffffffffffffc0;
  undefined1 uVar2;
  tar *tar_00;
  
  tar_00 = (tar *)0xffffffffffffffff;
  do {
    while( true ) {
      uVar2 = false;
      if ((char)(in_RDX->archive).magic != '\0') {
        uVar2 = (char)(in_RDX->archive).magic != ',';
      }
      if ((bool)uVar2 == false) break;
      if (((char)(in_RDX->archive).magic < '0') || ('9' < (char)(in_RDX->archive).magic)) {
        return L'\xffffffec';
      }
      in_RDX = (archive_read *)((long)&(in_RDX->archive).magic + 1);
    }
    if ((long)tar_00 < 0) {
      tar_00 = (tar *)tar_atol10((char *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8)
      ;
      if ((long)tar_00 < 0) {
        return L'\xffffffec';
      }
    }
    else {
      offset_00 = tar_atol10((char *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if (offset_00 < 0) {
        return L'\xffffffec';
      }
      wVar1 = gnu_add_sparse_entry
                        (in_RDX,tar_00,offset_00,CONCAT17(uVar2,in_stack_ffffffffffffffc0));
      if (wVar1 != L'\0') {
        return L'\xffffffe2';
      }
      tar_00 = (tar *)0xffffffffffffffff;
    }
    if ((char)(in_RDX->archive).magic == '\0') {
      return L'\0';
    }
    in_RDX = (archive_read *)((long)&(in_RDX->archive).magic + 1);
  } while( true );
}

Assistant:

static int
gnu_sparse_01_parse(struct archive_read *a, struct tar *tar, const char *p)
{
	const char *e;
	int64_t offset = -1, size = -1;

	for (;;) {
		e = p;
		while (*e != '\0' && *e != ',') {
			if (*e < '0' || *e > '9')
				return (ARCHIVE_WARN);
			e++;
		}
		if (offset < 0) {
			offset = tar_atol10(p, e - p);
			if (offset < 0)
				return (ARCHIVE_WARN);
		} else {
			size = tar_atol10(p, e - p);
			if (size < 0)
				return (ARCHIVE_WARN);
			if (gnu_add_sparse_entry(a, tar, offset, size)
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			offset = -1;
		}
		if (*e == '\0')
			return (ARCHIVE_OK);
		p = e + 1;
	}
}